

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_for.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference ppVar3;
  type *ppcVar4;
  type *ptVar5;
  ostream *poVar6;
  type *y;
  type *x;
  undefined8 local_60;
  _Self local_58;
  iterator __end1;
  iterator __begin1;
  map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
  *__range1;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  local_c = 0;
  local_18 = "Adrian";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_18);
  *pmVar2 = 0x3df;
  local_20 = "Kerrie";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_20);
  *pmVar2 = 0x390;
  local_28 = "Nicholas";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_28);
  *pmVar2 = 0x69;
  local_30 = "Elizabeth";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_30);
  *pmVar2 = 0xe7;
  local_38 = "Wilson";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar2 = 0x36a;
  __range1 = (map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
              *)anon_var_dwarf_2a55;
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,(key_type *)&__range1);
  *pmVar2 = 0xe4;
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  __end1 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::begin(&person);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
       ::end(&person);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_58);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_char_*const,_short>_>::operator*(&__end1);
    x = (type *)ppVar3->first;
    local_60._0_2_ = ppVar3->second;
    local_60._2_6_ = *(undefined6 *)&ppVar3->field_0xa;
    ppcVar4 = std::get<0ul,char_const*const,short>((pair<const_char_*const,_short> *)&x);
    ptVar5 = std::get<1ul,char_const*const,short>((pair<const_char_*const,_short> *)&x);
    poVar6 = std::operator<<((ostream *)&std::cout,"[\"");
    poVar6 = std::operator<<(poVar6,*ppcVar4);
    poVar6 = std::operator<<(poVar6,"\"]");
    poVar6 = std::operator<<(poVar6,"=\t");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*ptVar5);
    std::operator<<(poVar6,'\n');
    std::_Rb_tree_iterator<std::pair<const_char_*const,_short>_>::operator++(&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return local_c;
}

Assistant:

int main () {
	//Let's give the map values;
	person["Adrian"] 	= 991;
	person["Kerrie"] 	= 912;
	person["Nicholas"] 	= 105;
	person["Elizabeth"] = 231;
	person["Wilson"] 	= 874;
	person["Joyce"] 	= 228;

	std::cout << std::endl;
	for (auto[x,y] : person) {
		std::cout << "[\"" << x << "\"]" << "=\t" << y << '\n';
	}
	std::cout << std::endl;
}